

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O0

void __thiscall
tcu::ResultCollector::setTestContextResult(ResultCollector *this,TestContext *testCtx)

{
  qpTestResult testResult;
  char *description;
  string local_38;
  TestContext *local_18;
  TestContext *testCtx_local;
  ResultCollector *this_local;
  
  local_18 = testCtx;
  testCtx_local = (TestContext *)this;
  testResult = getResult(this);
  getMessage_abi_cxx11_(&local_38,this);
  description = (char *)std::__cxx11::string::c_str();
  TestContext::setTestResult(testCtx,testResult,description);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void ResultCollector::setTestContextResult (TestContext& testCtx)
{
	testCtx.setTestResult(getResult(), getMessage().c_str());
}